

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.cpp
# Opt level: O0

bool anon_unknown.dwarf_2c124::serialize_fundamental<long>
               (long *obj,SerializationBuffer *buffer,size_t *offset,Serialize *op)

{
  size_t sVar1;
  size_type sVar2;
  char *pcVar3;
  Serialize *in_RCX;
  size_t *in_RDX;
  vector<char,_std::allocator<char>_> *in_RSI;
  void *in_RDI;
  unsigned_long osize;
  
  sVar1 = *in_RDX;
  sVar2 = std::vector<char,_std::allocator<char>_>::size(in_RSI);
  if (sVar2 < sVar1 + 8) {
    std::vector<char,_std::allocator<char>_>::resize(in_RSI,(size_type)in_RDX);
  }
  pcVar3 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x145af2);
  memcpy(pcVar3 + *in_RDX,in_RDI,8);
  advance<GGSock::Serialize>(in_RDX,8,in_RCX);
  return true;
}

Assistant:

inline bool serialize_fundamental(const T & obj, GGSock::SerializationBuffer & buffer, size_t & offset, GGSock::Serialize & op) noexcept {
            static_assert(std::is_fundamental<T>::value, "Fundamental type required");

            auto osize = sizeof(obj);

            if (offset + osize > buffer.size()) {
                buffer.resize(offset + osize);
            }

            std::memcpy(buffer.data() + offset, &obj, osize);
            ::advance(offset, osize, op);

            return true;
        }